

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_entry_open(zip_t *zip,char *entryname)

{
  ulong uVar1;
  mz_zip_mode mVar2;
  mz_uint mVar3;
  mz_uint mVar4;
  mz_bool mVar5;
  uint uVar6;
  size_t n;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  time_t tVar10;
  char newchar;
  char oldchar;
  size_t __n;
  ulong uVar11;
  ulong uVar12;
  mz_uint64 mVar13;
  undefined1 auVar14 [16];
  mz_zip_archive_file_stat stats;
  mz_zip_archive_file_stat local_1038 [7];
  
  newchar = entryname == (char *)0x0 || zip == (zip_t *)0x0;
  if ((entryname != (char *)0x0 && zip != (zip_t *)0x0) && (n = strlen(entryname), n != 0)) {
    pcVar7 = strrpl(entryname,n,oldchar,newchar);
    (zip->entry).name = pcVar7;
    if (pcVar7 != (char *)0x0) {
      mVar2 = (zip->archive).m_zip_mode;
      if (mVar2 == MZ_ZIP_MODE_READING) {
        mVar4 = mz_zip_reader_locate_file(&zip->archive,pcVar7,(char *)0x0,0);
        (zip->entry).index = mVar4;
        if ((-1 < (int)mVar4) &&
           (mVar5 = mz_zip_reader_file_stat(&zip->archive,mVar4,local_1038), mVar5 != 0)) {
          auVar14._0_8_ = local_1038[0].m_uncomp_size;
          auVar14._8_4_ = (int)local_1038[0].m_comp_size;
          auVar14._12_4_ = local_1038[0].m_comp_size._4_4_;
          (zip->entry).uncomp_size = auVar14._0_8_;
          (zip->entry).comp_size = auVar14._8_8_;
          (zip->entry).uncomp_crc32 = local_1038[0].m_crc32;
          (zip->entry).offset = (ulong)local_1038[0].m_central_dir_ofs;
          (zip->entry).header_offset = local_1038[0].m_local_header_ofs;
          (zip->entry).method = local_1038[0].m_method;
          (zip->entry).external_attr = local_1038[0].m_external_attr;
          (zip->entry).m_time = local_1038[0].m_time;
          return 0;
        }
      }
      else {
        mVar13 = (zip->archive).m_archive_size;
        mVar4 = (zip->archive).m_file_offset_alignment;
        mVar3 = (zip->archive).m_total_files;
        (zip->entry).index = mVar3;
        (zip->entry).uncomp_size = 0;
        (zip->entry).comp_size = 0;
        (zip->entry).uncomp_crc32 = 0;
        (zip->entry).offset = mVar13;
        (zip->entry).header_offset = mVar13;
        (zip->entry).header[0] = '\0';
        (zip->entry).header[1] = '\0';
        (zip->entry).header[2] = '\0';
        (zip->entry).header[3] = '\0';
        (zip->entry).header[4] = '\0';
        (zip->entry).header[5] = '\0';
        (zip->entry).header[6] = '\0';
        (zip->entry).header[7] = '\0';
        (zip->entry).header[8] = '\0';
        (zip->entry).header[9] = '\0';
        (zip->entry).header[10] = '\0';
        (zip->entry).header[0xb] = '\0';
        (zip->entry).header[0xc] = '\0';
        (zip->entry).header[0xd] = '\0';
        (zip->entry).header[0xe] = '\0';
        (zip->entry).header[0xf] = '\0';
        (zip->entry).header[0xe] = '\0';
        (zip->entry).header[0xf] = '\0';
        (zip->entry).header[0x10] = '\0';
        (zip->entry).header[0x11] = '\0';
        (zip->entry).header[0x12] = '\0';
        (zip->entry).header[0x13] = '\0';
        (zip->entry).header[0x14] = '\0';
        (zip->entry).header[0x15] = '\0';
        (zip->entry).header[0x16] = '\0';
        (zip->entry).header[0x17] = '\0';
        (zip->entry).header[0x18] = '\0';
        (zip->entry).header[0x19] = '\0';
        (zip->entry).header[0x1a] = '\0';
        (zip->entry).header[0x1b] = '\0';
        (zip->entry).header[0x1c] = '\0';
        (zip->entry).header[0x1d] = '\0';
        (zip->entry).method = 0;
        (zip->entry).external_attr = 0;
        uVar6 = mVar4 - ((uint)mVar13 & mVar4 - 1) & mVar4 - 1;
        if (mVar4 == 0) {
          uVar6 = 0;
        }
        if ((((mVar2 == MZ_ZIP_MODE_WRITING) &&
             ((zip->archive).m_pState != (mz_zip_internal_state *)0x0)) &&
            (mVar3 != 0xffff && (zip->level & 0x400) == 0)) &&
           (uVar12 = (ulong)uVar6, n + mVar13 + uVar12 + 0x4c >> 0x20 == 0)) {
          uVar1 = uVar12 + 0x1e;
          __n = 0x1000;
          if ((uint)uVar1 < 0x1000) {
            __n = uVar1 & 0xffffffff;
          }
          memset(local_1038,0,__n);
          uVar11 = uVar1 & 0xffffffff;
          do {
            uVar6 = (uint)uVar11;
            if (uVar6 == 0) {
              mVar13 = uVar12 + (zip->entry).header_offset;
              (zip->entry).header_offset = mVar13;
              mVar4 = (zip->archive).m_file_offset_alignment;
              if ((mVar4 != 0) && (((uint)mVar13 & mVar4 - 1) != 0)) {
                __assert_fail("(zip->entry.header_offset & (pzip->m_file_offset_alignment - 1)) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/zip/src/zip.c"
                              ,0x139,"int zip_entry_open(struct zip_t *, const char *)");
              }
              mVar13 = uVar1 + (zip->entry).offset;
              (zip->entry).offset = mVar13;
              sVar9 = (*(zip->archive).m_pWrite)
                                ((zip->archive).m_pIO_opaque,mVar13,(zip->entry).name,n);
              if (sVar9 == n) {
                mVar13 = (zip->entry).offset + n;
                (zip->entry).offset = mVar13;
                uVar6 = zip->level & 0xf;
                if (uVar6 != 0) {
                  (zip->entry).state.m_pZip = &zip->archive;
                  (zip->entry).state.m_cur_archive_file_ofs = mVar13;
                  (zip->entry).state.m_comp_size = 0;
                  uVar12 = 10;
                  if (uVar6 < 10) {
                    uVar12 = (ulong)uVar6;
                  }
                  tdefl_init(&(zip->entry).comp,mz_zip_writer_add_put_buf_callback,
                             &(zip->entry).state,
                             (uint)(uVar6 < 4) << 0xe |
                             tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes
                             [uVar12]);
                }
                tVar10 = time((time_t *)0x0);
                (zip->entry).m_time = tVar10;
                return 0;
              }
              break;
            }
            sVar9 = 0x1000;
            if (uVar6 < 0x1000) {
              sVar9 = uVar11;
            }
            sVar8 = (*(zip->archive).m_pWrite)((zip->archive).m_pIO_opaque,mVar13,local_1038,sVar9);
            mVar13 = mVar13 + sVar9;
            uVar11 = (ulong)(uVar6 - (int)sVar9);
          } while (sVar8 == sVar9);
        }
      }
      pcVar7 = (zip->entry).name;
      if (pcVar7 != (char *)0x0) {
        free(pcVar7);
        (zip->entry).name = (char *)0x0;
      }
    }
  }
  return -1;
}

Assistant:

int zip_entry_open(struct zip_t *zip, const char *entryname) {
  size_t entrylen = 0;
  mz_zip_archive *pzip = NULL;
  mz_uint num_alignment_padding_bytes, level;
  mz_zip_archive_file_stat stats;

  if (!zip || !entryname) {
    return -1;
  }

  entrylen = strlen(entryname);
  if (entrylen < 1) {
    return -1;
  }

  /*
    .ZIP File Format Specification Version: 6.3.3

    4.4.17.1 The name of the file, with optional relative path.
    The path stored MUST not contain a drive or
    device letter, or a leading slash.  All slashes
    MUST be forward slashes '/' as opposed to
    backwards slashes '\' for compatibility with Amiga
    and UNIX file systems etc.  If input came from standard
    input, there is no file name field.
  */
  zip->entry.name = strrpl(entryname, entrylen, '\\', '/');
  if (!zip->entry.name) {
    // Cannot parse zip entry name
    return -1;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode == MZ_ZIP_MODE_READING) {
    zip->entry.index =
        mz_zip_reader_locate_file(pzip, zip->entry.name, NULL, 0);
    if (zip->entry.index < 0) {
      goto cleanup;
    }

    if (!mz_zip_reader_file_stat(pzip, (mz_uint)zip->entry.index, &stats)) {
      goto cleanup;
    }

    zip->entry.comp_size = stats.m_comp_size;
    zip->entry.uncomp_size = stats.m_uncomp_size;
    zip->entry.uncomp_crc32 = stats.m_crc32;
    zip->entry.offset = stats.m_central_dir_ofs;
    zip->entry.header_offset = stats.m_local_header_ofs;
    zip->entry.method = stats.m_method;
    zip->entry.external_attr = stats.m_external_attr;
    zip->entry.m_time = stats.m_time;

    return 0;
  }

  zip->entry.index = (int)zip->archive.m_total_files;
  zip->entry.comp_size = 0;
  zip->entry.uncomp_size = 0;
  zip->entry.uncomp_crc32 = MZ_CRC32_INIT;
  zip->entry.offset = zip->archive.m_archive_size;
  zip->entry.header_offset = zip->archive.m_archive_size;
  memset(zip->entry.header, 0, MZ_ZIP_LOCAL_DIR_HEADER_SIZE * sizeof(mz_uint8));
  zip->entry.method = 0;
  zip->entry.external_attr = 0;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pzip);

  if (!pzip->m_pState || (pzip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    // Wrong zip mode
    goto cleanup;
  }
  if (zip->level & MZ_ZIP_FLAG_COMPRESSED_DATA) {
    // Wrong zip compression level
    goto cleanup;
  }
  // no zip64 support yet
  if ((pzip->m_total_files == 0xFFFF) ||
      ((pzip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        entrylen) > 0xFFFFFFFF)) {
    // No zip64 support yet
    goto cleanup;
  }
  if (!mz_zip_writer_write_zeros(pzip, zip->entry.offset,
                                 num_alignment_padding_bytes +
                                     sizeof(zip->entry.header))) {
    // Cannot memset zip entry header
    goto cleanup;
  }

  zip->entry.header_offset += num_alignment_padding_bytes;
  if (pzip->m_file_offset_alignment) {
    MZ_ASSERT(
        (zip->entry.header_offset & (pzip->m_file_offset_alignment - 1)) == 0);
  }
  zip->entry.offset += num_alignment_padding_bytes + sizeof(zip->entry.header);

  if (pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.offset, zip->entry.name,
                     entrylen) != entrylen) {
    // Cannot write data to zip entry
    goto cleanup;
  }

  zip->entry.offset += entrylen;
  level = zip->level & 0xF;
  if (level) {
    zip->entry.state.m_pZip = pzip;
    zip->entry.state.m_cur_archive_file_ofs = zip->entry.offset;
    zip->entry.state.m_comp_size = 0;

    if (tdefl_init(&(zip->entry.comp), mz_zip_writer_add_put_buf_callback,
                   &(zip->entry.state),
                   (int)tdefl_create_comp_flags_from_zip_params(
                       (int)level, -15, MZ_DEFAULT_STRATEGY)) !=
        TDEFL_STATUS_OKAY) {
      // Cannot initialize the zip compressor
      goto cleanup;
    }
  }

  zip->entry.m_time = time(NULL);

  return 0;

cleanup:
  CLEANUP(zip->entry.name);
  return -1;
}